

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O0

void pstore::broker::gc_watch_thread::child_signal(int sig)

{
  gc_watch_thread *pgVar1;
  errno_saver local_10;
  int local_c;
  errno_saver old_errno;
  int sig_local;
  
  local_c = sig;
  errno_saver::errno_saver(&local_10);
  pgVar1 = getgc();
  signal_cv::notify_all(&pgVar1->cv_,local_c);
  errno_saver::~errno_saver(&local_10);
  return;
}

Assistant:

void gc_watch_thread::child_signal (int const sig) {
            errno_saver const old_errno; //! OCLint(PH - meant to be unused)
            getgc ().cv_.notify_all (sig);
        }